

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_lzip.c
# Opt level: O0

void test_compat_lzip(void)

{
  compat_lzip("test_compat_lzip_1.tlz");
  compat_lzip("test_compat_lzip_2.tlz");
  compat_lzip_3("test_compat_lzip_3.lz");
  compat_lzip_4("test_compat_lzip_4.tlz");
  return;
}

Assistant:

DEFINE_TEST(test_compat_lzip)
{
        /* This sample has been 'split', each piece compressed separately,
         * then concatenated.  lzip will emit the concatenated result. */
        compat_lzip("test_compat_lzip_1.tlz");
        /* This sample has been compressed as a single stream, but then
         * some unrelated garbage text has been appended to the end. */
        compat_lzip("test_compat_lzip_2.tlz");

        /* These samples have been compressed as multi stream and an eof
         * of a member is at a read buffer boundary. */
        compat_lzip_3("test_compat_lzip_3.lz");
        compat_lzip_4("test_compat_lzip_4.tlz");
}